

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O1

compile_errcode __thiscall VariableDefinition::Parse(VariableDefinition *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  LogTools *log_tools_ptr;
  SymbolName SVar3;
  long *plVar4;
  size_type *psVar5;
  undefined4 uVar6;
  compile_errcode unaff_R13D;
  allocator local_71;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  paVar1 = &local_70.field_2;
  uVar6 = 0;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar6) {
    case 0:
      uVar6 = 1;
      if ((SVar3 & ~SWITCH_SYM) == INT_SYM) goto switchD_0012b070_caseD_4;
      unaff_R13D = -1;
      uVar6 = 0;
      break;
    case 1:
      uVar6 = 2;
      if (SVar3 == IDENTIFIER_SYM) goto switchD_0012b070_caseD_4;
      std::__cxx11::string::string((string *)local_50,symbol_name_string[SVar3],&local_71);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x160ce2);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      GrammaErrorLogs(log_tools_ptr,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      unaff_R13D = -1;
      uVar6 = 1;
      break;
    case 2:
      if (SVar3 == L_SQUARE_BRACKET_SYM) {
        uVar6 = 0xb;
      }
      else {
        if (SVar3 != SEMICOLON_SYM) {
          if (SVar3 == COMMA_SYM) goto LAB_0012b1d1;
          local_70._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"expected a \'[\' or \',\' or \';\'","");
          GrammaErrorLogs(log_tools_ptr,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          unaff_R13D = 0;
          uVar6 = 2;
          break;
        }
LAB_0012b239:
        uVar6 = 3;
      }
    default:
switchD_0012b070_caseD_4:
      SymbolQueue::NextSymbol(handle_symbol_queue);
      bVar2 = true;
      goto LAB_0012b2f7;
    case 3:
      unaff_R13D = 0;
      break;
    case 0xb:
      uVar6 = 0xc;
      if (SVar3 == INTERGER_SYM) goto switchD_0012b070_caseD_4;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"expected a valid identifier","");
      GrammaErrorLogs(log_tools_ptr,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      unaff_R13D = -1;
      uVar6 = 0xb;
      break;
    case 0xc:
      uVar6 = 0xd;
      if (SVar3 == R_SQUARE_BRACKET_SYM) goto switchD_0012b070_caseD_4;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"expected a \']\'","");
      GrammaErrorLogs(log_tools_ptr,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      unaff_R13D = 0;
      uVar6 = 0xc;
      break;
    case 0xd:
      if (SVar3 == COMMA_SYM) {
LAB_0012b1d1:
        uVar6 = 1;
        goto switchD_0012b070_caseD_4;
      }
      if (SVar3 == SEMICOLON_SYM) goto LAB_0012b239;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"expected a \',\' or \';\'","");
      GrammaErrorLogs(log_tools_ptr,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      unaff_R13D = 0;
      uVar6 = 0xd;
    }
    bVar2 = false;
LAB_0012b2f7:
    if (!bVar2) {
      return unaff_R13D;
    }
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Parse() {
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier, but get a " + string(symbol_name_string[name]));
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '[' or ',' or ';'");
                    //return NOT_MATCH;
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier");
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ']'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ',' or ';'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}